

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
SimpleDictionaryTypeHandlerBase
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *this,
          Recycler *recycler,int slotCapacity,uint16 inlineSlotCapacity,uint16 offsetOfInlineSlots,
          bool isLocked,bool isShared)

{
  Type *addr;
  int capacity;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *alloc;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  byte bVar4;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  bVar4 = 0x18;
  if (!isShared) {
    bVar4 = 0;
  }
  DynamicTypeHandler::DynamicTypeHandler
            (&this->super_DynamicTypeHandler,slotCapacity,inlineSlotCapacity,offsetOfInlineSlots,
             (bVar4 | isLocked << 2) + 1);
  (this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler = (_func_int **)&PTR_GetCppName_015533a0
  ;
  (this->propertyMap).ptr =
       (BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
        *)0x0;
  (this->singletonInstance).ptr = (RecyclerWeakReference<Js::DynamicObject> *)0x0;
  this->field_0x28 = (this->field_0x28 & 0xf8) + 1;
  this->numDeletedProperties = '\0';
  this->nextPropertyIndex = 0;
  DynamicTypeHandler::SetIsInlineSlotCapacityLocked(&this->super_DynamicTypeHandler);
  if (0xfffe < slotCapacity) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x136,"(slotCapacity <= MaxPropertyIndexSize)",
                                "slotCapacity <= MaxPropertyIndexSize");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  addr = &this->propertyMap;
  local_58 = (undefined1  [8])
             &JsUtil::
              BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9ef1b8b;
  data.filename._0_4_ = 0x137;
  alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_58);
  this_00 = (BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
             *)new<Memory::Recycler>(0x38,alloc,0x38bbb2);
  capacity = (this->super_DynamicTypeHandler).slotCapacity;
  (this_00->buckets).ptr = (int *)0x0;
  (this_00->entries).ptr =
       (Entry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
        *)0x0;
  this_00->alloc = recycler;
  this_00->size = 0;
  this_00->bucketCount = 0;
  this_00->count = 0;
  this_00->freeCount = 0;
  this_00->modFunctionIndex = 0x4b;
  this_00->stats = (Type)0x0;
  if (0 < capacity) {
    JsUtil::
    BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
    ::Initialize(this_00,capacity);
  }
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = this_00;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  return;
}

Assistant:

SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SimpleDictionaryTypeHandlerBase(Recycler * recycler, int slotCapacity, uint16 inlineSlotCapacity, uint16 offsetOfInlineSlots, bool isLocked, bool isShared) :
        // Do not RoundUp passed in slotCapacity. This may be called by ConvertTypeHandler for an existing DynamicObject and should use the real existing slotCapacity.
        DynamicTypeHandler(slotCapacity, inlineSlotCapacity, offsetOfInlineSlots, DefaultFlags | (isLocked ? IsLockedFlag : 0) | (isShared ? (MayBecomeSharedFlag | IsSharedFlag) : 0)),
        nextPropertyIndex(0),
        singletonInstance(nullptr),
        _gc_tag(true),
        isUnordered(false),
        hasNamelessPropertyId(false),
        numDeletedProperties(0)
    {
        SetIsInlineSlotCapacityLocked();
        Assert(slotCapacity <= MaxPropertyIndexSize);
        propertyMap = RecyclerNew(recycler, SimplePropertyDescriptorMap, recycler, this->GetSlotCapacity());
    }